

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O0

void __thiscall Image_SampleSimple_Test::~Image_SampleSimple_Test(Image_SampleSimple_Test *this)

{
  void *in_RDI;
  
  ~Image_SampleSimple_Test((Image_SampleSimple_Test *)0x5d72a8);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(Image, SampleSimple) {
    pstd::vector<float> texels = {Float(0), Float(1), Float(0), Float(0)};
    Image zeroOne(texels, {2, 2}, {"Y"});
    PiecewiseConstant2D distrib(zeroOne.GetSamplingDistribution());
    RNG rng;
    for (int i = 0; i < 1000; ++i) {
        Point2f u(rng.Uniform<Float>(), rng.Uniform<Float>());
        Float pdf;
        Point2f p = distrib.Sample(u, &pdf);
        // Due to bilerp on lookup, the non-zero range goes out a bit.
        EXPECT_GE(p.x, 0.5);
        EXPECT_LE(p.y, 0.5);
    }
}